

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int IDASetLSNormFactor(void *ida_mem,sunrealtype nrmfac)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_20;
  double local_18;
  IDAMem local_10;
  
  local_18 = nrmfac;
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetLSNormFactor",&local_10,&local_20);
  if (iVar1 != 0) {
    return iVar1;
  }
  dVar4 = local_18;
  if (local_18 <= 0.0) {
    if (0.0 <= local_18) {
      lVar2 = N_VGetLength(local_20->ytemp);
      if (lVar2 < 1) {
        dVar4 = 0.0;
        goto LAB_00113e41;
      }
      lVar2 = N_VGetLength(local_20->ytemp);
      dVar4 = (double)lVar2;
    }
    else {
      N_VConst(0x3ff0000000000000);
      dVar3 = (double)N_VDotProd(local_20->ytemp,local_20->ytemp);
      dVar4 = 0.0;
      if (dVar3 <= 0.0) goto LAB_00113e41;
      dVar4 = (double)N_VDotProd(local_20->ytemp,local_20->ytemp);
    }
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
LAB_00113e41:
  local_20->nrmfac = dVar4;
  return 0;
}

Assistant:

int IDASetLSNormFactor(void* ida_mem, sunrealtype nrmfac)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  if (nrmfac > ZERO)
  {
    /* user-provided factor */
    idals_mem->nrmfac = nrmfac;
  }
  else if (nrmfac < ZERO)
  {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, idals_mem->ytemp);
    idals_mem->nrmfac = SUNRsqrt(N_VDotProd(idals_mem->ytemp, idals_mem->ytemp));
  }
  else
  {
    /* compute default factor for WRMS norm from vector legnth */
    idals_mem->nrmfac = SUNRsqrt(N_VGetLength(idals_mem->ytemp));
  }

  return (IDALS_SUCCESS);
}